

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_utility.cpp
# Opt level: O3

CSVReader * __thiscall
csv::parse(CSVReader *__return_storage_ptr__,csv *this,string_view in,CSVFormat *format)

{
  vector<char,_std::allocator<char>_> *__x;
  stringstream stream;
  allocator<char> local_219;
  long *local_218 [2];
  long local_208 [2];
  CSVFormat local_1f8;
  stringstream local_1a0 [128];
  ios_base local_120 [264];
  
  __x = (vector<char,_std::allocator<char>_> *)in._M_str;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_218,(char *)in._M_len,&local_219);
  std::__cxx11::stringstream::stringstream(local_1a0,(string *)local_218,_S_out|_S_in);
  if (local_218[0] != local_208) {
    operator_delete(local_218[0],local_208[0] + 1);
  }
  std::vector<char,_std::allocator<char>_>::vector(&local_1f8.possible_delimiters,__x);
  std::vector<char,_std::allocator<char>_>::vector(&local_1f8.trim_chars,__x + 1);
  local_1f8._52_2_ =
       *(undefined2 *)
        ((long)&__x[2].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start + 4);
  local_1f8.header =
       *(int *)&__x[2].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1f8.col_names,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__x[2].super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish);
  local_1f8.variable_column_policy =
       *(VariableColumnPolicy *)
        &__x[3].super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_finish;
  CSVReader::
  CSVReader<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (__return_storage_ptr__,
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
             &local_1f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1f8.col_names);
  if (local_1f8.trim_chars.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.trim_chars.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.trim_chars.super__Vector_base<char,_std::allocator<char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.trim_chars.super__Vector_base<char,_std::allocator<char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1f8.possible_delimiters.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.possible_delimiters.super__Vector_base<char,_std::allocator<char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f8.possible_delimiters.
                          super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.possible_delimiters.
                          super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

CSV_INLINE CSVReader parse(csv::string_view in, CSVFormat format) {
        std::stringstream stream(in.data());
        return CSVReader(stream, format);
    }